

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageConfigValue(Fts5Storage *p,char *z,sqlite3_value *pVal,int iVal)

{
  int iNew_00;
  int local_34;
  int iNew;
  int rc;
  sqlite3_stmt *pReplace;
  sqlite3_value *psStack_20;
  int iVal_local;
  sqlite3_value *pVal_local;
  char *z_local;
  Fts5Storage *p_local;
  
  _iNew = (sqlite3_stmt *)0x0;
  pReplace._4_4_ = iVal;
  psStack_20 = pVal;
  pVal_local = (sqlite3_value *)z;
  z_local = (char *)p;
  local_34 = fts5StorageGetStmt(p,9,(sqlite3_stmt **)&iNew,(char **)0x0);
  if (local_34 == 0) {
    sqlite3_bind_text(_iNew,1,(char *)pVal_local,-1,(_func_void_void_ptr *)0x0);
    if (psStack_20 == (sqlite3_value *)0x0) {
      sqlite3_bind_int(_iNew,2,pReplace._4_4_);
    }
    else {
      sqlite3_bind_value(_iNew,2,psStack_20);
    }
    sqlite3_step(_iNew);
    local_34 = sqlite3_reset(_iNew);
    sqlite3_bind_null(_iNew,1);
  }
  if ((local_34 == 0) && (psStack_20 != (sqlite3_value *)0x0)) {
    iNew_00 = *(int *)(*(long *)z_local + 0x78) + 1;
    local_34 = sqlite3Fts5IndexSetCookie(*(Fts5Index **)(z_local + 8),iNew_00);
    if (local_34 == 0) {
      *(int *)(*(long *)z_local + 0x78) = iNew_00;
    }
  }
  return local_34;
}

Assistant:

static int sqlite3Fts5StorageConfigValue(
  Fts5Storage *p, 
  const char *z,
  sqlite3_value *pVal,
  int iVal
){
  sqlite3_stmt *pReplace = 0;
  int rc = fts5StorageGetStmt(p, FTS5_STMT_REPLACE_CONFIG, &pReplace, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_text(pReplace, 1, z, -1, SQLITE_STATIC);
    if( pVal ){
      sqlite3_bind_value(pReplace, 2, pVal);
    }else{
      sqlite3_bind_int(pReplace, 2, iVal);
    }
    sqlite3_step(pReplace);
    rc = sqlite3_reset(pReplace);
    sqlite3_bind_null(pReplace, 1);
  }
  if( rc==SQLITE_OK && pVal ){
    int iNew = p->pConfig->iCookie + 1;
    rc = sqlite3Fts5IndexSetCookie(p->pIndex, iNew);
    if( rc==SQLITE_OK ){
      p->pConfig->iCookie = iNew;
    }
  }
  return rc;
}